

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.h
# Opt level: O1

void __thiscall
rpn::RPNExpression::Push<rpn::QuotedArgExpression,unsigned_long&>
          (RPNExpression *this,unsigned_long *args)

{
  pointer *__ptr;
  __uniq_ptr_impl<rpn::IExpression,_std::default_delete<rpn::IExpression>_> local_18;
  
  local_18._M_t.super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>.
  super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl =
       (tuple<rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>)operator_new(0x10);
  *(unsigned_long *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>.
          super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl + 8) = *args;
  *(undefined ***)
   local_18._M_t.super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>.
   super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl = &PTR__IExpression_00113c00;
  std::
  vector<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>,std::allocator<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>>>
  ::emplace_back<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>>
            ((vector<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>,std::allocator<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>>>
              *)this,(unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_> *)
                     &local_18);
  if ((_Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>)
      local_18._M_t.
      super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>.
      super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl != (IExpression *)0x0) {
    (**(code **)(*(long *)local_18._M_t.
                          super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>
                          .super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl + 8))();
  }
  return;
}

Assistant:

void Push(ExprArgs&&... args)
    {
        Push(std::make_unique<ExprT>(std::forward<ExprArgs>(args)...));
    }